

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::addConstructor
          (TParseContext *this,TSourceLoc *loc,TIntermNode *node,TType *type)

{
  TType *pTVar1;
  TIntermNode *pTVar2;
  int iVar3;
  uint uVar4;
  TOperator TVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermOperator *this_00;
  undefined4 extraout_var_02;
  reference ppTVar8;
  undefined4 extraout_var_03;
  long *plVar9;
  uint *puVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  undefined4 extraout_var_06;
  reference pTVar11;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  reference ppTVar12;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  TQualifier *pTVar13;
  ulong uVar14;
  bool bVar15;
  TIntermAggregate *agg_node;
  char *specConstantCompositeExt [1];
  TIntermTyped *ret_node;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_1b8;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_1b0;
  iterator p;
  bool isConstConstructor;
  bool hasSpecConst;
  int paramCount;
  TIntermSequence *sequenceVector;
  TParseContext *local_190;
  TIntermTyped *newNode;
  undefined1 local_180 [7];
  bool singleArg;
  TType dereferenced;
  TType elementType;
  __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_48;
  const_iterator memberTypes;
  TOperator op;
  TIntermAggregate *aggrNode;
  TType *type_local;
  TIntermNode *node_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  undefined4 extraout_var_01;
  
  if ((node == (TIntermNode *)0x0) ||
     (iVar3 = (*node->_vptr_TIntermNode[3])(), CONCAT44(extraout_var,iVar3) == 0)) {
    this_local = (TParseContext *)0x0;
  }
  else {
    iVar3 = (*node->_vptr_TIntermNode[3])();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x43])
              (this,loc,"constructor",CONCAT44(extraout_var_00,iVar3));
    iVar3 = (*node->_vptr_TIntermNode[6])();
    this_00 = (TIntermOperator *)CONCAT44(extraout_var_01,iVar3);
    memberTypes._M_current._4_4_ =
         TIntermediate::mapTypeToConstructorOp
                   ((this->super_TParseContextBase).super_TParseVersions.intermediate,type);
    if ((memberTypes._M_current._4_4_ == EOpConstructTextureSampler) &&
       (this_00 != (TIntermOperator *)0x0)) {
      iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           CONCAT44(extraout_var_02,iVar3),1);
      iVar3 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
      plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0xf0))();
      puVar10 = (uint *)(**(code **)(*plVar9 + 0x40))();
      if ((*puVar10 >> 0x11 & 1) != 0) {
        iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        ppTVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                             CONCAT44(extraout_var_04,iVar3),0);
        iVar3 = (*(*ppTVar8)->_vptr_TIntermNode[3])();
        plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0xf8))();
        puVar10 = (uint *)(**(code **)(*plVar9 + 0x48))();
        *puVar10 = *puVar10 & 0xfffdffff | 0x20000;
      }
      this_local = (TParseContext *)
                   TIntermediate::setAggregateOperator
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              (TIntermNode *)this_00,memberTypes._M_current._4_4_,type,loc);
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
      ::__normal_iterator(&local_48);
      if (memberTypes._M_current._4_4_ == EOpConstructStruct) {
        this_01 = &TType::getStruct(type)->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        local_48._M_current =
             (TTypeLoc *)
             std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                       (this_01);
      }
      TType::TType((TType *)&dereferenced.spirvType,EbtVoid,EvqTemporary,1,0,0,false);
      uVar4 = (*type->_vptr_TType[0x1d])();
      if ((uVar4 & 1) == 0) {
        TType::shallowCopy((TType *)&dereferenced.spirvType,type);
      }
      else {
        TType::TType((TType *)local_180,type,0,false);
        TType::shallowCopy((TType *)&dereferenced.spirvType,(TType *)local_180);
        TType::~TType((TType *)local_180);
      }
      if (this_00 == (TIntermOperator *)0x0) {
        bVar15 = true;
      }
      else {
        TVar5 = TIntermOperator::getOp(this_00);
        bVar15 = TVar5 != EOpNull;
      }
      if (bVar15) {
        uVar4 = (*type->_vptr_TType[0x1d])();
        TVar5 = memberTypes._M_current._4_4_;
        if ((uVar4 & 1) == 0) {
          if (memberTypes._M_current._4_4_ == EOpConstructStruct) {
            pTVar11 = __gnu_cxx::
                      __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                      ::operator*(&local_48);
            pTVar1 = pTVar11->type;
            iVar3 = (**node->_vptr_TIntermNode)();
            local_190 = (TParseContext *)
                        constructAggregate(this,node,pTVar1,1,
                                           (TSourceLoc *)CONCAT44(extraout_var_07,iVar3));
          }
          else {
            iVar3 = (*node->_vptr_TIntermNode[3])();
            iVar6 = (**node->_vptr_TIntermNode)();
            local_190 = (TParseContext *)
                        constructBuiltIn(this,type,TVar5,
                                         (TIntermTyped *)CONCAT44(extraout_var_08,iVar3),
                                         (TSourceLoc *)CONCAT44(extraout_var_09,iVar6),false);
          }
        }
        else {
          iVar3 = (**node->_vptr_TIntermNode)();
          local_190 = (TParseContext *)
                      constructAggregate(this,node,(TType *)&dereferenced.spirvType,1,
                                         (TSourceLoc *)CONCAT44(extraout_var_06,iVar3));
        }
        if ((local_190 != (TParseContext *)0x0) &&
           ((uVar4 = (*type->_vptr_TType[0x1d])(), (uVar4 & 1) != 0 ||
            (memberTypes._M_current._4_4_ == EOpConstructStruct)))) {
          local_190 = (TParseContext *)
                      TIntermediate::setAggregateOperator
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 (TIntermNode *)local_190,EOpConstructStruct,type,loc);
        }
        this_local = local_190;
      }
      else {
        iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        p._M_current._4_4_ = 0;
        p._M_current._3_1_ = 0;
        p._M_current._2_1_ = 1;
        local_1b0._M_current =
             (TIntermNode **)
             std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                       ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                        CONCAT44(extraout_var_10,iVar3));
        while( true ) {
          local_1b8._M_current =
               (TIntermNode **)
               std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                         ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                          CONCAT44(extraout_var_10,iVar3));
          bVar15 = __gnu_cxx::operator!=(&local_1b0,&local_1b8);
          if (!bVar15) break;
          uVar4 = (*type->_vptr_TType[0x1d])();
          TVar5 = memberTypes._M_current._4_4_;
          if ((uVar4 & 1) == 0) {
            if (memberTypes._M_current._4_4_ == EOpConstructStruct) {
              ppTVar12 = __gnu_cxx::
                         __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                         ::operator*(&local_1b0);
              pTVar2 = *ppTVar12;
              pTVar11 = __gnu_cxx::
                        __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                        ::operator[](&local_48,(long)p._M_current._4_4_);
              pTVar1 = pTVar11->type;
              iVar6 = p._M_current._4_4_ + 1;
              iVar7 = (**node->_vptr_TIntermNode)();
              local_190 = (TParseContext *)
                          constructAggregate(this,pTVar2,pTVar1,iVar6,
                                             (TSourceLoc *)CONCAT44(extraout_var_12,iVar7));
            }
            else {
              ppTVar12 = __gnu_cxx::
                         __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                         ::operator*(&local_1b0);
              iVar6 = (*(*ppTVar12)->_vptr_TIntermNode[3])();
              iVar7 = (**node->_vptr_TIntermNode)();
              local_190 = (TParseContext *)
                          constructBuiltIn(this,type,TVar5,
                                           (TIntermTyped *)CONCAT44(extraout_var_13,iVar6),
                                           (TSourceLoc *)CONCAT44(extraout_var_14,iVar7),true);
            }
          }
          else {
            ppTVar12 = __gnu_cxx::
                       __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                       ::operator*(&local_1b0);
            pTVar2 = *ppTVar12;
            iVar6 = p._M_current._4_4_ + 1;
            iVar7 = (**node->_vptr_TIntermNode)();
            local_190 = (TParseContext *)
                        constructAggregate(this,pTVar2,(TType *)&dereferenced.spirvType,iVar6,
                                           (TSourceLoc *)CONCAT44(extraout_var_11,iVar7));
          }
          if (local_190 == (TParseContext *)0x0) {
            this_local = (TParseContext *)0x0;
            goto LAB_006835ee;
          }
          ppTVar12 = __gnu_cxx::
                     __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                     ::operator*(&local_1b0);
          *ppTVar12 = (TIntermNode *)local_190;
          iVar6 = (*((TIntermNode *)&local_190->super_TParseContextBase)->_vptr_TIntermNode[0x1e])()
          ;
          pTVar13 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_15,iVar6) + 0x58))();
          bVar15 = TQualifier::isConstant(pTVar13);
          if (!bVar15) {
            p._M_current._2_1_ = 0;
          }
          iVar6 = (*((TIntermNode *)&local_190->super_TParseContextBase)->_vptr_TIntermNode[0x1e])()
          ;
          pTVar13 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_16,iVar6) + 0x58))();
          bVar15 = TQualifier::isSpecConstant(pTVar13);
          if (bVar15) {
            p._M_current._3_1_ = 1;
          }
          __gnu_cxx::
          __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
          ::operator++(&local_1b0,0);
          p._M_current._4_4_ = p._M_current._4_4_ + 1;
        }
        specConstantCompositeExt[0] =
             (char *)TIntermediate::setAggregateOperator
                               ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                (TIntermNode *)this_00,memberTypes._M_current._4_4_,type,loc);
        agg_node = (TIntermAggregate *)anon_var_dwarf_6df5ea;
        uVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0xc])
                          (this,loc,1,&agg_node,"spec constant aggregate constructor");
        if ((((uVar4 & 1) != 0) && ((p._M_current._2_1_ & 1) != 0)) &&
           ((p._M_current._3_1_ & 1) != 0)) {
          plVar9 = (long *)(**(code **)(*(long *)specConstantCompositeExt[0] + 0xf8))();
          pTVar13 = (TQualifier *)(**(code **)(*plVar9 + 0x50))();
          TQualifier::makeSpecConstant(pTVar13);
        }
        plVar9 = (long *)(**(code **)(*(long *)specConstantCompositeExt[0] + 0x30))();
        if ((plVar9 != (long *)0x0) &&
           (((uVar14 = (**(code **)(*plVar9 + 0x158))(), (uVar14 & 1) != 0 ||
             (uVar14 = (**(code **)(*plVar9 + 0x150))(), (uVar14 & 1) != 0)) ||
            (uVar14 = (**(code **)(*plVar9 + 0x148))(), (uVar14 & 1) != 0)))) {
          (**(code **)(*plVar9 + 0x180))();
        }
        this_local = (TParseContext *)specConstantCompositeExt[0];
      }
LAB_006835ee:
      TType::~TType((TType *)&dereferenced.spirvType);
    }
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TParseContext::addConstructor(const TSourceLoc& loc, TIntermNode* node, const TType& type)
{
    if (node == nullptr || node->getAsTyped() == nullptr)
        return nullptr;
    rValueErrorCheck(loc, "constructor", node->getAsTyped());

    TIntermAggregate* aggrNode = node->getAsAggregate();
    TOperator op = intermediate.mapTypeToConstructorOp(type);

    // Combined texture-sampler constructors are completely semantic checked
    // in constructorTextureSamplerError()
    if (op == EOpConstructTextureSampler) {
        if (aggrNode != nullptr) {
            if (aggrNode->getSequence()[1]->getAsTyped()->getType().getSampler().shadow) {
                // Transfer depth into the texture (SPIR-V image) type, as a hint
                // for tools to know this texture/image is a depth image.
                aggrNode->getSequence()[0]->getAsTyped()->getWritableType().getSampler().shadow = true;
            }
            return intermediate.setAggregateOperator(aggrNode, op, type, loc);
        }
    }

    TTypeList::const_iterator memberTypes;
    if (op == EOpConstructStruct)
        memberTypes = type.getStruct()->begin();

    TType elementType;
    if (type.isArray()) {
        TType dereferenced(type, 0);
        elementType.shallowCopy(dereferenced);
    } else
        elementType.shallowCopy(type);

    bool singleArg;
    if (aggrNode) {
        if (aggrNode->getOp() != EOpNull)
            singleArg = true;
        else
            singleArg = false;
    } else
        singleArg = true;

    TIntermTyped *newNode;
    if (singleArg) {
        // If structure constructor or array constructor is being called
        // for only one parameter inside the structure, we need to call constructAggregate function once.
        if (type.isArray())
            newNode = constructAggregate(node, elementType, 1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(node, *(*memberTypes).type, 1, node->getLoc());
        else
            newNode = constructBuiltIn(type, op, node->getAsTyped(), node->getLoc(), false);

        if (newNode && (type.isArray() || op == EOpConstructStruct))
            newNode = intermediate.setAggregateOperator(newNode, EOpConstructStruct, type, loc);

        return newNode;
    }

    //
    // Handle list of arguments.
    //
    TIntermSequence &sequenceVector = aggrNode->getSequence();    // Stores the information about the parameter to the constructor
    // if the structure constructor contains more than one parameter, then construct
    // each parameter

    int paramCount = 0;  // keeps track of the constructor parameter number being checked

    // We don't know "top down" whether type is a specialization constant,
    // but a const becomes a specialization constant if any of its children are.
    bool hasSpecConst = false;
    bool isConstConstructor = true;

    // for each parameter to the constructor call, check to see if the right type is passed or convert them
    // to the right type if possible (and allowed).
    // for structure constructors, just check if the right type is passed, no conversion is allowed.
    for (TIntermSequence::iterator p = sequenceVector.begin();
                                   p != sequenceVector.end(); p++, paramCount++) {
        if (type.isArray())
            newNode = constructAggregate(*p, elementType, paramCount+1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(*p, *(memberTypes[paramCount]).type, paramCount+1, node->getLoc());
        else
            newNode = constructBuiltIn(type, op, (*p)->getAsTyped(), node->getLoc(), true);

        if (newNode) {
            *p = newNode;
            if (!newNode->getType().getQualifier().isConstant())
                isConstConstructor = false;
            if (newNode->getType().getQualifier().isSpecConstant())
                hasSpecConst = true;
        } else
            return nullptr;
    }

    TIntermTyped* ret_node = intermediate.setAggregateOperator(aggrNode, op, type, loc);

    const char *specConstantCompositeExt[] = { E_GL_EXT_spec_constant_composites };
    if (checkExtensionsRequested(loc, 1, specConstantCompositeExt, "spec constant aggregate constructor")) {
        if (isConstConstructor && hasSpecConst) {
            ret_node->getWritableType().getQualifier().makeSpecConstant();
        }
    }

    TIntermAggregate *agg_node = ret_node->getAsAggregate();
    if (agg_node && (agg_node->isVector() || agg_node->isArray() || agg_node->isMatrix()))
        agg_node->updatePrecision();

    return ret_node;
}